

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isRealTable(Parse *pParse,Table *pTab)

{
  char *local_28;
  char *zType;
  Table *pTab_local;
  Parse *pParse_local;
  
  local_28 = (char *)0x0;
  if (pTab->pSelect != (Select *)0x0) {
    local_28 = "view";
  }
  if (pTab->nModuleArg != 0) {
    local_28 = "virtual table";
  }
  if (local_28 != (char *)0x0) {
    sqlite3ErrorMsg(pParse,"cannot rename columns of %s \"%s\"",local_28,pTab->zName);
  }
  pParse_local._4_4_ = (uint)(local_28 != (char *)0x0);
  return pParse_local._4_4_;
}

Assistant:

static int isRealTable(Parse *pParse, Table *pTab){
  const char *zType = 0;
#ifndef SQLITE_OMIT_VIEW
  if( pTab->pSelect ){
    zType = "view";
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    zType = "virtual table";
  }
#endif
  if( zType ){
    sqlite3ErrorMsg(
        pParse, "cannot rename columns of %s \"%s\"", zType, pTab->zName
    );
    return 1;
  }
  return 0;
}